

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O3

float GeneratePinkNoise(PinkNoise *pink)

{
  uint uVar1;
  long lVar2;
  float *pfVar3;
  uint uVar4;
  float fVar5;
  
  uVar4 = pink->pink_Index + 1U & pink->pink_IndexMask;
  pink->pink_Index = uVar4;
  if (uVar4 != 0) {
    lVar2 = 0;
    uVar1 = uVar4 & 1;
    while (uVar1 == 0) {
      lVar2 = lVar2 + 1;
      uVar1 = uVar4 & 2;
      uVar4 = (int)uVar4 >> 1;
    }
    GenerateRandomNumber_randSeed = GenerateRandomNumber_randSeed * 0xbb38435 + 0x3619636b;
    pink->pink_RunningSum =
         (pink->pink_RunningSum - pink->pink_Rows[lVar2]) + (GenerateRandomNumber_randSeed >> 0x28);
    pink->pink_Rows[lVar2] = GenerateRandomNumber_randSeed >> 0x28;
  }
  GenerateRandomNumber_randSeed = GenerateRandomNumber_randSeed * 0xbb38435 + 0x3619636b;
  fVar5 = (float)((GenerateRandomNumber_randSeed >> 0x28) + pink->pink_RunningSum) *
          pink->pink_Scalar;
  if (fVar5 <= pinkMax) {
    if (pinkMin <= fVar5) {
      return fVar5;
    }
    pfVar3 = &pinkMin;
  }
  else {
    pfVar3 = &pinkMax;
  }
  *pfVar3 = fVar5;
  return fVar5;
}

Assistant:

float GeneratePinkNoise( PinkNoise *pink )
{
    long newRandom;
    long sum;
    float output;
    /* Increment and mask index. */
    pink->pink_Index = (pink->pink_Index + 1) & pink->pink_IndexMask;
    /* If index is zero, don't update any random values. */
    if( pink->pink_Index != 0 )
    {
        /* Determine how many trailing zeros in PinkIndex. */
        /* This algorithm will hang if n==0 so test first. */
        int numZeros = 0;
        int n = pink->pink_Index;
        while( (n & 1) == 0 )
        {
            n = n >> 1;
            numZeros++;
        }
        /* Replace the indexed ROWS random value.
         * Subtract and add back to RunningSum instead of adding all the random
         * values together. Only one changes each time.
         */
        pink->pink_RunningSum -= pink->pink_Rows[numZeros];
        newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
        pink->pink_RunningSum += newRandom;
        pink->pink_Rows[numZeros] = newRandom;
    }

    /* Add extra white noise value. */
    newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
    sum = pink->pink_RunningSum + newRandom;
    /* Scale to range of -1.0 to 0.9999. */
    output = pink->pink_Scalar * sum;
#ifdef PINK_MEASURE
    /* Check Min/Max */
    if( output > pinkMax ) pinkMax = output;
    else if( output < pinkMin ) pinkMin = output;
#endif
    return output;
}